

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::TextureUnitTests::init(TextureUnitTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Context *pCVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  TestNode *pTVar6;
  TestNode *pTVar7;
  long *extraout_RAX;
  long *plVar8;
  uint uVar9;
  char *name;
  long lVar10;
  string countGroupName;
  long *local_200 [2];
  long local_1f0 [2];
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  TestNode *local_1c0;
  long local_1b8;
  TestNode *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar10 = 0;
  do {
    iVar1 = deqp::gles2::Functional::TextureUnitTests::init::unitCounts[lVar10];
    if (lVar10 == 3) {
      local_200[0] = local_1f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"all","");
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    plVar5 = (long *)std::__cxx11::string::append((char *)local_200);
    local_1e0 = &local_1d0;
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_1d0 = *plVar8;
      lStack_1c8 = plVar5[3];
    }
    else {
      local_1d0 = *plVar8;
      local_1e0 = (long *)*plVar5;
    }
    local_1d8 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_200[0] != local_1f0) {
      operator_delete(local_200[0],local_1f0[0] + 1);
    }
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               (char *)local_1e0,glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild((TestNode *)this,pTVar6);
    uVar4 = 0;
    local_1c0 = pTVar6;
    local_1b8 = lVar10;
    do {
      pTVar6 = local_1c0;
      name = "mixed";
      if (uVar4 < 4) {
        name = &DAT_01bf5f8c + *(int *)(&DAT_01bf5f8c + (ulong)uVar4 * 4);
      }
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,name,
                 glcts::fixed_sample_locations_values + 1);
      tcu::TestNode::addChild(pTVar6,pTVar7);
      uVar9 = 0;
      local_1b0 = pTVar7;
      do {
        pTVar7 = (TestNode *)operator_new(0x158);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::ostream::operator<<(local_1a8,uVar9);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,pCVar2->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_200[0],
                   glcts::fixed_sample_locations_values + 1);
        pTVar6 = local_1b0;
        uVar3 = (uVar9 ^ 0x3d) * 9;
        uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
        pTVar7[1]._vptr_TestNode = (_func_int **)pCVar2;
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TextureUnitCase_02138440;
        *(int *)&pTVar7[1].m_testCtx = iVar1;
        *(uint *)((long)&pTVar7[1].m_testCtx + 4) = uVar4;
        *(uint *)&pTVar7[1].m_name._M_dataplus._M_p = uVar3 >> 0xf ^ uVar3;
        memset(&pTVar7[1].m_name.field_2,0,200);
        tcu::TestNode::addChild(pTVar6,pTVar7);
        if (local_200[0] != local_1f0) {
          operator_delete(local_200[0],local_1f0[0] + 1);
        }
        lVar10 = local_1b8;
        uVar9 = uVar9 + 1;
      } while (uVar9 != 10);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 5);
    plVar5 = &local_1d0;
    if (local_1e0 != plVar5) {
      operator_delete(local_1e0,local_1d0 + 1);
      plVar5 = extraout_RAX;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  return (int)plVar5;
}

Assistant:

void TextureUnitTests::init (void)
{
	const int numTestsPerGroup = 10;

	static const int unitCounts[] =
	{
		2,
		4,
		8,
		-1 // \note Negative stands for the implementation-specified maximum.
	};

	for (int unitCountNdx = 0; unitCountNdx < DE_LENGTH_OF_ARRAY(unitCounts); unitCountNdx++)
	{
		int numUnits = unitCounts[unitCountNdx];

		string countGroupName = (unitCounts[unitCountNdx] < 0 ? "all" : de::toString(numUnits)) + "_units";

		tcu::TestCaseGroup* countGroup = new tcu::TestCaseGroup(m_testCtx, countGroupName.c_str(), "");
		addChild(countGroup);

		DE_STATIC_ASSERT((int)TextureUnitCase::CASE_ONLY_2D == 0);

		for (int caseType = (int)TextureUnitCase::CASE_ONLY_2D; caseType < (int)TextureUnitCase::CASE_LAST; caseType++)
		{
			const char* caseTypeGroupName = (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_2D		? "only_2d"
										  : (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_CUBE		? "only_cube"
										  : (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_2D_ARRAY	? "only_2d_array"
										  : (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_3D		? "only_3d"
										  : (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_MIXED			? "mixed"
										  : DE_NULL;

			DE_ASSERT(caseTypeGroupName != DE_NULL);

			tcu::TestCaseGroup* caseTypeGroup = new tcu::TestCaseGroup(m_testCtx, caseTypeGroupName, "");
			countGroup->addChild(caseTypeGroup);

			for (int testNdx = 0; testNdx < numTestsPerGroup; testNdx++)
				caseTypeGroup->addChild(new TextureUnitCase(m_context, de::toString(testNdx).c_str(), "", numUnits, (TextureUnitCase::CaseType)caseType, deUint32Hash((deUint32)testNdx)));
		}
	}
}